

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O0

void __thiscall
spdlog::details::scoped_padder::scoped_padder
          (scoped_padder *this,size_t wrapped_size,padding_info *padinfo,memory_buf_t *dest)

{
  ulong uVar1;
  long count;
  long reminder;
  long half_pad;
  memory_buf_t *dest_local;
  padding_info *padinfo_local;
  size_t wrapped_size_local;
  scoped_padder *this_local;
  
  this->padinfo_ = padinfo;
  this->dest_ = dest;
  fmt::v10::basic_string_view<char>::basic_string_view
            (&this->spaces_,"                                                                ",0x40)
  ;
  this->remaining_pad_ = padinfo->width_ - wrapped_size;
  if (0 < this->remaining_pad_) {
    if (this->padinfo_->side_ == left) {
      pad_it(this,this->remaining_pad_);
      this->remaining_pad_ = 0;
    }
    else if (this->padinfo_->side_ == center) {
      count = this->remaining_pad_ / 2;
      uVar1 = this->remaining_pad_;
      pad_it(this,count);
      this->remaining_pad_ = count + (uVar1 & 1);
    }
  }
  return;
}

Assistant:

scoped_padder(size_t wrapped_size, const padding_info &padinfo, memory_buf_t &dest)
        : padinfo_(padinfo),
          dest_(dest) {
        remaining_pad_ = static_cast<long>(padinfo.width_) - static_cast<long>(wrapped_size);
        if (remaining_pad_ <= 0) {
            return;
        }

        if (padinfo_.side_ == padding_info::pad_side::left) {
            pad_it(remaining_pad_);
            remaining_pad_ = 0;
        } else if (padinfo_.side_ == padding_info::pad_side::center) {
            auto half_pad = remaining_pad_ / 2;
            auto reminder = remaining_pad_ & 1;
            pad_it(half_pad);
            remaining_pad_ = half_pad + reminder;  // for the right side
        }
    }